

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int streamResizeBuffer(roslz4_stream *str,int block_size_id)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  int in_ESI;
  long in_RDI;
  stream_state *state;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  if ((in_ESI < 4) || (7 < in_ESI)) {
    local_4 = -4;
  }
  else {
    *(int *)(in_RDI + 0x24) = in_ESI;
    *(undefined4 *)(lVar1 + 0x1c) = 0;
    iVar2 = roslz4_blockSizeFromIndex(*(int *)(in_RDI + 0x24));
    *(int *)(lVar1 + 0x18) = iVar2;
    pvVar3 = malloc((long)*(int *)(lVar1 + 0x18));
    *(void **)(lVar1 + 0x10) = pvVar3;
    if (*(long *)(lVar1 + 0x10) == 0) {
      local_4 = -5;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int streamResizeBuffer(roslz4_stream *str, int block_size_id) {
  stream_state *state = str->state;
  if (!(4 <= block_size_id && block_size_id <= 7)) {
    return ROSLZ4_PARAM_ERROR; // Invalid block size
  }

  str->block_size_id = block_size_id;
  state->buffer_offset = 0;
  state->buffer_size = roslz4_blockSizeFromIndex(str->block_size_id);
  state->buffer = (char*) malloc(sizeof(char) * state->buffer_size);
  if (state->buffer == NULL) {
    return ROSLZ4_MEMORY_ERROR; // Allocation of buffer failed
  }
  return ROSLZ4_OK;
}